

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall Minisat::StringOption::reset(StringOption *this)

{
  char *pcVar1;
  string *psVar2;
  allocator local_39;
  string local_38 [32];
  
  psVar2 = this->value;
  pcVar1 = this->defaultValue;
  if (pcVar1 == (char *)0x0) {
    if (psVar2 != (string *)0x0) {
      std::__cxx11::string::~string((string *)psVar2);
      operator_delete(psVar2);
      this->value = (string *)0x0;
    }
  }
  else if (psVar2 == (string *)0x0) {
    psVar2 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)psVar2,pcVar1,(allocator *)local_38);
    this->value = psVar2;
  }
  else {
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::__cxx11::string::operator=((string *)this->value,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

virtual void reset()
    {
        if (defaultValue == NULL) {
            if (value != NULL) {
                delete value;
                value = NULL;
            }
        } else {
            if (value != NULL) {
                *value = std::string(defaultValue);
            } else {
                value = new std::string(defaultValue);
            }
        }
    }